

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall
OpenMD::ReplicateVisitor::replicate
          (ReplicateVisitor *this,
          vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
          *infoList,shared_ptr<OpenMD::AtomData> *data,Mat3x3d *box)

{
  bool bVar1;
  element_type *v;
  RectMatrix<double,_3U,_3U> *in_RDX;
  iterator i;
  iterator dirIter;
  shared_ptr<OpenMD::AtomInfo> newAtomInfo;
  AtomInfo *in_stack_ffffffffffffff18;
  AtomInfo *in_stack_ffffffffffffff20;
  iterator local_60;
  iterator local_58;
  iterator local_50;
  iterator local_48;
  iterator local_40;
  iterator local_38;
  
  std::shared_ptr<OpenMD::AtomInfo>::shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34c046);
  __gnu_cxx::
  __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
  ::__normal_iterator(&stack0xffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
  ::__normal_iterator(&stack0xffffffffffffffc0);
  local_48 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::begin
                       ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)in_stack_ffffffffffffff18);
  local_38 = local_48;
  while( true ) {
    local_50 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::end
                         ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)in_stack_ffffffffffffff18);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) break;
    local_58 = std::
               vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
               ::begin((vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                        *)in_stack_ffffffffffffff18);
    local_40 = local_58;
    while( true ) {
      local_60 = std::
                 vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                 ::end((vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                        *)in_stack_ffffffffffffff18);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
                          *)in_stack_ffffffffffffff20,
                         (__normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
                          *)in_stack_ffffffffffffff18);
      if (!bVar1) break;
      std::make_shared<OpenMD::AtomInfo>();
      std::shared_ptr<OpenMD::AtomInfo>::operator=
                ((shared_ptr<OpenMD::AtomInfo> *)in_stack_ffffffffffffff20,
                 (shared_ptr<OpenMD::AtomInfo> *)in_stack_ffffffffffffff18);
      std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34c144);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
      ::operator*(&stack0xffffffffffffffc0);
      v = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_ffffffffffffff20);
      std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                in_stack_ffffffffffffff20);
      AtomInfo::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      __gnu_cxx::
      __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
      ::operator*(&stack0xffffffffffffffc8);
      OpenMD::operator*(in_RDX,(Vector<double,_3U> *)v);
      std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x34c1b2);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_ffffffffffffff20,
                 (Vector<double,_3U> *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff18 =
           (AtomInfo *)
           std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x34c1cf);
      in_stack_ffffffffffffff20 = (AtomInfo *)&stack0xffffffffffffff58;
      std::shared_ptr<OpenMD::AtomInfo>::shared_ptr
                ((shared_ptr<OpenMD::AtomInfo> *)in_stack_ffffffffffffff20,
                 (shared_ptr<OpenMD::AtomInfo> *)in_stack_ffffffffffffff18);
      AtomData::addAtomInfo
                ((AtomData *)in_stack_ffffffffffffff20,
                 (shared_ptr<OpenMD::AtomInfo> *)in_stack_ffffffffffffff18);
      std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34c204);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::AtomInfo>_*,_std::vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>_>
      ::operator++(&stack0xffffffffffffffc0);
    }
    __gnu_cxx::
    __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
    ::operator++(&stack0xffffffffffffffc8);
  }
  std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x34c261);
  return;
}

Assistant:

void ReplicateVisitor::replicate(
      std::vector<std::shared_ptr<AtomInfo>>& infoList,
      std::shared_ptr<AtomData> data, const Mat3x3d& box) {
    std::shared_ptr<AtomInfo> newAtomInfo;
    std::vector<Vector3d>::iterator dirIter;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;

    for (dirIter = dir.begin(); dirIter != dir.end(); ++dirIter) {
      for (i = infoList.begin(); i != infoList.end(); ++i) {
        newAtomInfo  = std::make_shared<AtomInfo>();
        *newAtomInfo = *(*i);
        newAtomInfo->pos += box * (*dirIter);
        data->addAtomInfo(newAtomInfo);
      }
    }
  }